

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void cfd::core::MergePsbtInputItem
               (wally_psbt_input *psbt,wally_psbt_input *psbt_dest,bool ignore_duplicate_error,
               string *item_name)

{
  uint32_t uVar1;
  wally_tx *p;
  wally_tx_output *p_00;
  wally_tx_output *pwVar2;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  CfdException *pCVar6;
  uint8_t *puVar7;
  allocator local_b1;
  string field_name;
  int ret;
  uint8_t *local_88;
  undefined1 local_80 [32];
  size_t local_60;
  uint8_t *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p = psbt_dest->utxo;
  if (p != (wally_tx *)0x0) {
    if (psbt->utxo == (wally_tx *)0x0) {
      ret = wally_psbt_input_set_utxo(psbt,p);
      if (ret != 0) {
        field_name._M_dataplus._M_p = "cfdcore_psbt.cpp";
        field_name._M_string_length._0_4_ = 0x1ca;
        field_name.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_5b4112;
        logger::warn<int&>((CfdSourceLocation *)&field_name,"wally_psbt_input_set_utxo NG[{}]",&ret)
        ;
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&field_name,"psbt set utxo error.",(allocator *)local_80);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&field_name);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    else {
      bVar5 = MatchWallyTx(psbt->utxo,p);
      if (!bVar5 && !ignore_duplicate_error) {
        field_name._M_dataplus._M_p = "cfdcore_psbt.cpp";
        field_name._M_string_length._0_4_ = 0x1d2;
        field_name.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_5b4112;
        logger::warn<>((CfdSourceLocation *)&field_name,"psbt txin utxo already exist.");
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&field_name,"psbt txin utxo duplicated error.",(allocator *)local_80);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&field_name);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  p_00 = psbt_dest->witness_utxo;
  if (p_00 != (wally_tx_output *)0x0) {
    pwVar2 = psbt->witness_utxo;
    if (pwVar2 == (wally_tx_output *)0x0) {
      ret = wally_psbt_input_set_witness_utxo(psbt,p_00);
      if (ret != 0) {
        field_name._M_dataplus._M_p = "cfdcore_psbt.cpp";
        field_name._M_string_length._0_4_ = 0x1db;
        field_name.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_5b4112;
        logger::warn<int&>((CfdSourceLocation *)&field_name,
                           "wally_psbt_input_set_witness_utxo NG[{}]",&ret);
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&field_name,"psbt set witness utxo error.",(allocator *)local_80);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&field_name);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    else {
      if (pwVar2->satoshi == p_00->satoshi) {
        puVar7 = pwVar2->script;
        local_88 = (uint8_t *)pwVar2->script_len;
        local_58 = p_00->script;
        local_60 = p_00->script_len;
        ::std::__cxx11::string::string((string *)&field_name,"scriptPubkey",(allocator *)local_80);
        bVar5 = ComparePsbtData(puVar7,(size_t)local_88,local_58,local_60,item_name,&field_name,
                                ignore_duplicate_error);
        ::std::__cxx11::string::~string((string *)&field_name);
      }
      else {
        bVar5 = false;
      }
      if (bVar5 == false && !ignore_duplicate_error) {
        field_name._M_dataplus._M_p = "cfdcore_psbt.cpp";
        field_name._M_string_length._0_4_ = 0x1ea;
        field_name.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_5b4112;
        logger::warn<>((CfdSourceLocation *)&field_name,"psbt txin witness utxo already exist.");
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&field_name,"psbt txin witness utxo duplicated error.",
                   (allocator *)local_80);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&field_name);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  uVar1 = psbt_dest->sighash;
  if (uVar1 != 0) {
    if (psbt->sighash == 0) {
      psbt->sighash = uVar1;
    }
    else if (psbt->sighash != uVar1 && !ignore_duplicate_error) {
      ::std::__cxx11::string::string((string *)&field_name,"txin sighashtype",(allocator *)local_80)
      ;
      local_80._0_8_ = "cfdcore_psbt.cpp";
      local_80._8_4_ = 0x1f9;
      local_80._16_8_ = "MergePsbtInputItem";
      logger::warn<std::__cxx11::string&>
                ((CfdSourceLocation *)local_80,"psbt {} already exist.",&field_name);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::operator+(&local_50,"psbt ",&field_name);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                       ,&local_50," duplicated error.");
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_80);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  sVar3 = psbt_dest->redeem_script_len;
  if (sVar3 != 0) {
    sVar4 = psbt->redeem_script_len;
    if (sVar4 == 0) {
      puVar7 = AllocWallyBuffer(psbt_dest->redeem_script,sVar3);
      psbt->redeem_script = puVar7;
      psbt->redeem_script_len = psbt_dest->redeem_script_len;
    }
    else {
      puVar7 = psbt->redeem_script;
      local_88 = psbt_dest->redeem_script;
      ::std::__cxx11::string::string
                ((string *)&field_name,"txin redeem script",(allocator *)&local_50);
      ::std::__cxx11::string::string((string *)local_80,"",&local_b1);
      ComparePsbtData(puVar7,sVar4,local_88,sVar3,&field_name,(string *)local_80,
                      ignore_duplicate_error);
      ::std::__cxx11::string::~string((string *)local_80);
      ::std::__cxx11::string::~string((string *)&field_name);
    }
  }
  sVar3 = psbt_dest->witness_script_len;
  if (sVar3 != 0) {
    sVar4 = psbt->witness_script_len;
    if (sVar4 == 0) {
      puVar7 = AllocWallyBuffer(psbt_dest->witness_script,sVar3);
      psbt->witness_script = puVar7;
      psbt->witness_script_len = psbt_dest->witness_script_len;
    }
    else {
      puVar7 = psbt->witness_script;
      local_88 = psbt_dest->witness_script;
      ::std::__cxx11::string::string
                ((string *)&field_name,"txin witness script",(allocator *)&local_50);
      ::std::__cxx11::string::string((string *)local_80,"",&local_b1);
      ComparePsbtData(puVar7,sVar4,local_88,sVar3,&field_name,(string *)local_80,
                      ignore_duplicate_error);
      ::std::__cxx11::string::~string((string *)local_80);
      ::std::__cxx11::string::~string((string *)&field_name);
    }
  }
  ::std::__cxx11::string::string((string *)&field_name,"txin keypaths",(allocator *)local_80);
  MergeWallyMap(&psbt->keypaths,&psbt_dest->keypaths,&field_name,ignore_duplicate_error);
  ::std::__cxx11::string::~string((string *)&field_name);
  ::std::__cxx11::string::string((string *)&field_name,"txin signatures",(allocator *)local_80);
  MergeWallyMap(&psbt->signatures,&psbt_dest->signatures,&field_name,ignore_duplicate_error);
  ::std::__cxx11::string::~string((string *)&field_name);
  ::std::__cxx11::string::string((string *)&field_name,"txin unknowns",(allocator *)local_80);
  MergeWallyMap(&psbt->unknowns,&psbt_dest->unknowns,&field_name,ignore_duplicate_error);
  ::std::__cxx11::string::~string((string *)&field_name);
  return;
}

Assistant:

void MergePsbtInputItem(
    struct wally_psbt_input *psbt, const struct wally_psbt_input *psbt_dest,
    bool ignore_duplicate_error, const std::string &item_name) {
  int ret;
  if (psbt_dest->utxo != nullptr) {
    if (psbt->utxo == nullptr) {
      ret = wally_psbt_input_set_utxo(psbt, psbt_dest->utxo);
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_psbt_input_set_utxo NG[{}]", ret);
        throw CfdException(kCfdIllegalArgumentError, "psbt set utxo error.");
      }
    } else if (MatchWallyTx(psbt->utxo, psbt_dest->utxo)) {
      // match
    } else if (ignore_duplicate_error) {
      // do nothing
    } else {
      warn(CFD_LOG_SOURCE, "psbt txin utxo already exist.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt txin utxo duplicated error.");
    }
  }
  if (psbt_dest->witness_utxo != nullptr) {
    if (psbt->witness_utxo == nullptr) {
      ret = wally_psbt_input_set_witness_utxo(psbt, psbt_dest->witness_utxo);
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_psbt_input_set_witness_utxo NG[{}]", ret);
        throw CfdException(
            kCfdIllegalArgumentError, "psbt set witness utxo error.");
      }
    } else if (
        (psbt->witness_utxo->satoshi == psbt_dest->witness_utxo->satoshi) &&
        ComparePsbtData(
            psbt->witness_utxo->script, psbt->witness_utxo->script_len,
            psbt_dest->witness_utxo->script,
            psbt_dest->witness_utxo->script_len, item_name, "scriptPubkey",
            ignore_duplicate_error)) {
      // match
    } else if (ignore_duplicate_error) {
      // do nothing
    } else {
      warn(CFD_LOG_SOURCE, "psbt txin witness utxo already exist.");
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt txin witness utxo duplicated error.");
    }
  }
  if (psbt_dest->sighash > 0) {
    if (psbt->sighash == 0) {
      psbt->sighash = psbt_dest->sighash;
    } else if (psbt->sighash == psbt_dest->sighash) {
      // match
    } else if (ignore_duplicate_error) {
      // do nothing
    } else {
      std::string field_name = "txin sighashtype";
      warn(CFD_LOG_SOURCE, "psbt {} already exist.", field_name);
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt " + field_name + " duplicated error.");
    }
  }
  if (psbt_dest->redeem_script_len > 0) {
    if (psbt->redeem_script_len == 0) {
      psbt->redeem_script = AllocWallyBuffer(
          psbt_dest->redeem_script, psbt_dest->redeem_script_len);
      psbt->redeem_script_len = psbt_dest->redeem_script_len;
    } else {
      ComparePsbtData(
          psbt->redeem_script, psbt->redeem_script_len,
          psbt_dest->redeem_script, psbt_dest->redeem_script_len,
          "txin redeem script", "", ignore_duplicate_error);
    }
  }
  if (psbt_dest->witness_script_len > 0) {
    if (psbt->witness_script_len == 0) {
      psbt->witness_script = AllocWallyBuffer(
          psbt_dest->witness_script, psbt_dest->witness_script_len);
      psbt->witness_script_len = psbt_dest->witness_script_len;
    } else {
      ComparePsbtData(
          psbt->witness_script, psbt->witness_script_len,
          psbt_dest->witness_script, psbt_dest->witness_script_len,
          "txin witness script", "", ignore_duplicate_error);
    }
  }
  MergeWallyMap(
      &psbt->keypaths, &psbt_dest->keypaths, "txin keypaths",
      ignore_duplicate_error);
  MergeWallyMap(
      &psbt->signatures, &psbt_dest->signatures, "txin signatures",
      ignore_duplicate_error);
  MergeWallyMap(
      &psbt->unknowns, &psbt_dest->unknowns, "txin unknowns",
      ignore_duplicate_error);
}